

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

bool __thiscall CKey::Derive(CKey *this,CKey *keyChild,ChainCode *ccChild,uint nChild,ChainCode *cc)

{
  array<unsigned_char,_32UL> *paVar1;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> t;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  secure_unique_ptr<KeyType> *this_00;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vout;
  CPubKey pubkey;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_98;
  CPubKey local_79;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->keydata)._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
      (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x125,
                  "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const");
  }
  if (this->fCompressed == false) {
    __assert_fail("IsCompressed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x126,
                  "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const");
  }
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start =
       secure_allocator<unsigned_char>::allocate((secure_allocator<unsigned_char> *)&local_98,0x40);
  local_98._M_impl.super__Vector_impl_data._M_finish =
       local_98._M_impl.super__Vector_impl_data._M_start + 0x40;
  local_98._M_impl.super__Vector_impl_data._M_start[0] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[1] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[2] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[3] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[4] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[5] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[6] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[7] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[8] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[9] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[10] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0xb] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0xc] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0xd] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0xe] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0xf] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x10] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x11] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x12] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x13] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x14] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x15] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x16] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x17] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x18] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x19] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x1a] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x1b] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x1c] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x1d] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x1e] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x1f] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x20] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x21] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x22] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x23] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x24] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x25] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x26] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x27] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x28] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x29] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x2a] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x2b] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x2c] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x2d] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x2e] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x2f] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x30] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x31] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x32] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x33] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x34] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x35] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x36] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x37] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x38] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x39] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x3a] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x3b] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x3c] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x3d] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x3e] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_start[0x3f] = '\0';
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98._M_impl.super__Vector_impl_data._M_finish;
  if ((int)nChild < 0) {
    paVar1 = (this->keydata)._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    if (paVar1 == (array<unsigned_char,_32UL> *)0x0) {
      __assert_fail("size() == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x12d,
                    "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const")
      ;
    }
    BIP32Hash(cc,nChild,'\0',paVar1->_M_elems,local_98._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    GetPubKey(&local_79,this);
    if ((local_79.vch[0] & 0xfe) != 2) {
      __assert_fail("pubkey.size() == CPubKey::COMPRESSED_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x12a,
                    "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const")
      ;
    }
    BIP32Hash(cc,nChild,local_79.vch[0],local_79.vch + 1,
              local_98._M_impl.super__Vector_impl_data._M_start);
  }
  uVar2 = *(undefined8 *)(local_98._M_impl.super__Vector_impl_data._M_start + 0x20);
  uVar3 = *(undefined8 *)(local_98._M_impl.super__Vector_impl_data._M_start + 0x28);
  uVar4 = *(undefined8 *)(local_98._M_impl.super__Vector_impl_data._M_start + 0x38);
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined8 *)(local_98._M_impl.super__Vector_impl_data._M_start + 0x30);
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar4;
  *(undefined8 *)(ccChild->super_base_blob<256U>).m_data._M_elems = uVar2;
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 8) = uVar3;
  paVar1 = (this->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  Set<std::byte_const*>(keyChild,paVar1->_M_elems,paVar1[1]._M_elems,true);
  iVar5 = secp256k1_ec_seckey_tweak_add
                    (secp256k1_context_sign,
                     ((keyChild->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems,local_98._M_impl.super__Vector_impl_data._M_start);
  if (iVar5 == 0) {
    this_00 = &keyChild->keydata;
    t._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (array<unsigned_char,_32UL> *)0x0;
    if (t._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)this_00,t._M_head_impl);
    }
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::Derive(CKey& keyChild, ChainCode &ccChild, unsigned int nChild, const ChainCode& cc) const {
    assert(IsValid());
    assert(IsCompressed());
    std::vector<unsigned char, secure_allocator<unsigned char>> vout(64);
    if ((nChild >> 31) == 0) {
        CPubKey pubkey = GetPubKey();
        assert(pubkey.size() == CPubKey::COMPRESSED_SIZE);
        BIP32Hash(cc, nChild, *pubkey.begin(), pubkey.begin()+1, vout.data());
    } else {
        assert(size() == 32);
        BIP32Hash(cc, nChild, 0, UCharCast(begin()), vout.data());
    }
    memcpy(ccChild.begin(), vout.data()+32, 32);
    keyChild.Set(begin(), begin() + 32, true);
    bool ret = secp256k1_ec_seckey_tweak_add(secp256k1_context_sign, (unsigned char*)keyChild.begin(), vout.data());
    if (!ret) keyChild.ClearKeyData();
    return ret;
}